

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::GetDescriptor
          (SimpleTypeHandler<1UL> *this,PropertyId propertyId,PropertyIndex *index)

{
  int iVar1;
  ushort uVar2;
  
  iVar1 = this->propertyCount;
  uVar2 = 0;
  do {
    if (iVar1 <= (int)(uint)uVar2) {
LAB_00cc3668:
      return (uint)((int)(uint)uVar2 < iVar1);
    }
    if ((this->descriptors[uVar2].Id.ptr)->pid == propertyId) {
      *index = uVar2;
      goto LAB_00cc3668;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

BOOL SimpleTypeHandler<size>::GetDescriptor(PropertyId propertyId, PropertyIndex * index)
    {
        for (PropertyIndex i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                *index = i;
                return true;
            }
        }
        return false;
    }